

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SstInternalProvideTimestep
               (SstStream Stream,SstData LocalMetadata,SstData Data,ssize_t Timestep,
               FFSFormatList Formats,DataFreeFunc FreeTimestep,void *FreeClientData,
               SstData AttributeData,DataFreeFunc FreeAttributeData,void *FreeAttributelientData)

{
  size_t sVar1;
  uint uVar2;
  CPTimestepList p_Var3;
  SstStream Stream_00;
  void *__ptr;
  int *piVar4;
  FFSFormatList pFVar5;
  WS_ReaderInfo p_Var6;
  int iVar7;
  size_t in_RCX;
  _SstData *in_RDX;
  _SstData *in_RSI;
  SstStream in_RDI;
  long in_R8;
  DataFreeFunc in_R9;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  StreamStatus LocalStatus;
  WS_ReaderInfo reader;
  int i;
  void *MetadataFreeValue;
  RegisterQueue ArrivingReader;
  _ReturnMetadataInfo TimestepMetaData;
  int DiscardThisTimestep;
  FFSFormatList tmp;
  int PendingReaderCount;
  CPTimestepList Entry;
  _MetadataPlusDPInfo Md;
  void *DP_TimestepInfo;
  _TimestepMetadataMsg *Msg;
  ReturnMetadataInfo ReturnData;
  MetadataPlusDPInfo *pointers;
  void *data_block2;
  void *data_block1;
  uint in_stack_fffffffffffffec8;
  StreamStatus in_stack_fffffffffffffecc;
  SstStream in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  SstStream in_stack_fffffffffffffee0;
  _TimestepMetadataMsg *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  CPTimestepList in_stack_fffffffffffffef8;
  SstStream in_stack_ffffffffffffff00;
  void **in_stack_ffffffffffffff08;
  FFSTypeHandle in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  SstStream in_stack_ffffffffffffff20;
  void **in_stack_ffffffffffffff38;
  _ReleaseRec *__ptr_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  void *in_stack_ffffffffffffff48;
  _ReleaseRec *__ptr_01;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint local_9c;
  long local_98;
  int local_8c;
  void *local_60;
  _TimestepMetadataMsg *local_58;
  void *in_stack_ffffffffffffffc0;
  void *local_38;
  
  local_58 = (_TimestepMetadataMsg *)malloc(0x38);
  local_60 = (void *)0x0;
  p_Var3 = (CPTimestepList)calloc(1,0x70);
  memset(local_58,0,0x38);
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  in_RDI->WriterTimestep = in_RCX;
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  (*in_RDI->DP_Interface->provideTimestep)(&Svcs,in_RDI->DP_Stream,in_RDX,in_RSI,in_RCX,&local_60);
  local_98 = in_R8;
  if (in_R8 != 0) {
    for (; local_98 != 0; local_98 = *(long *)(local_98 + 0x20)) {
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  if ((in_RDX != (_SstData *)0x0) && (_perfstubs_initialized == 1)) {
    if (SstInternalProvideTimestep::__var2102 == (void *)0x0) {
      SstInternalProvideTimestep::__var2102 = (void *)ps_create_counter_("Timestep local data size")
      ;
    }
    sVar1 = in_RDX->DataSize;
    auVar8._8_4_ = (int)(sVar1 >> 0x20);
    auVar8._0_8_ = sVar1;
    auVar8._12_4_ = 0x45300000;
    ps_sample_counter_((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),
                       SstInternalProvideTimestep::__var2102);
  }
  if ((in_RSI != (_SstData *)0x0) && (_perfstubs_initialized == 1)) {
    if (SstInternalProvideTimestep::__var2106 == (void *)0x0) {
      SstInternalProvideTimestep::__var2106 =
           (void *)ps_create_counter_("Timestep local metadata size");
    }
    sVar1 = in_RSI->DataSize;
    auVar9._8_4_ = (int)(sVar1 >> 0x20);
    auVar9._0_8_ = sVar1;
    auVar9._12_4_ = 0x45300000;
    ps_sample_counter_((auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),
                       SstInternalProvideTimestep::__var2106);
  }
  in_RDI->LastProvidedTimestep = in_RCX;
  if ((in_RDI->ConfigParams->FirstTimestepPrecious != 0) && (in_RCX == 0)) {
    p_Var3->PreciousTimestep = 1;
  }
  p_Var3->ReferenceCount = 1;
  p_Var3->DPRegistered = 1;
  p_Var3->Timestep = in_RCX;
  p_Var3->Msg = local_58;
  p_Var3->MetadataArray = local_58->Metadata;
  p_Var3->DP_TimestepInfo = local_58->DP_TimestepInfo;
  p_Var3->FreeTimestep = in_R9;
  p_Var3->FreeClientData = reader;
  p_Var3->Next = in_RDI->QueuedTimesteps;
  p_Var3->InProgressFlag = 1;
  in_RDI->QueuedTimesteps = p_Var3;
  in_RDI->QueuedTimestepCount = in_RDI->QueuedTimestepCount + 1;
  (in_RDI->Stats).TimestepsCreated = (in_RDI->Stats).TimestepsCreated + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerMD == (void *)0x0) {
      SstInternalProvideTimestep::timerMD =
           (void *)ps_timer_create_("Metadata Consolidation time in EndStep()");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerMD);
  }
  Stream_00 = (SstStream)
              CP_consolidateDataToRankZero
                        ((SstStream)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48,
                         (FFSTypeHandle)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
  if (in_RDI->Rank == 0) {
    local_9c = 0;
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
    in_stack_fffffffffffffee8 = (_TimestepMetadataMsg *)in_RDI->ReaderRegisterQueue;
    QueueMaintenance((SstStream)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (in_RDI->QueueFullPolicy == SstQueueFullDiscard) {
      CP_verbose(in_RDI,TraceVerbose,
                 "Testing Discard Condition, Queued Timestep Count %d, QueueLimit %d\n",
                 (ulong)(uint)in_RDI->QueuedTimestepCount,(ulong)(uint)in_RDI->QueueLimit);
      QueueMaintenance((SstStream)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_9c = (uint)(in_RDI->QueueLimit < in_RDI->QueuedTimestepCount);
    }
    else {
      while( true ) {
        uVar2 = in_stack_fffffffffffffec8 & 0xffffff;
        if (0 < in_RDI->QueueLimit) {
          uVar2 = CONCAT13(in_RDI->QueueLimit < in_RDI->QueuedTimestepCount,
                           (int3)in_stack_fffffffffffffec8);
        }
        in_stack_fffffffffffffec8 = uVar2;
        if ((char)(in_stack_fffffffffffffec8 >> 0x18) == '\0') break;
        CP_verbose(in_RDI,PerStepVerbose,"Blocking on QueueFull condition\n");
        pthread_cond_wait((pthread_cond_t *)&in_RDI->DataCondition,
                          (pthread_mutex_t *)&in_RDI->DataLock);
      }
    }
    memset(&stack0xfffffffffffffef0,0,0x70);
    in_stack_fffffffffffffef4 = 0;
    for (; in_stack_fffffffffffffee8 != (_TimestepMetadataMsg *)0x0;
        in_stack_fffffffffffffee8 = *(_TimestepMetadataMsg **)&in_stack_fffffffffffffee8->CohortSize
        ) {
      in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 + 1;
    }
    __ptr_00 = in_RDI->ReleaseList;
    __ptr_01 = in_RDI->LockDefnsList;
    __ptr = malloc((long)in_RDI->ReaderCount << 2);
    for (in_stack_fffffffffffffedc = 0; in_stack_fffffffffffffedc < in_RDI->ReaderCount;
        in_stack_fffffffffffffedc = in_stack_fffffffffffffedc + 1) {
      *(StreamStatus *)((long)__ptr + (long)in_stack_fffffffffffffedc * 4) =
           in_RDI->Readers[in_stack_fffffffffffffedc]->ReaderStatus;
    }
    in_RDI->ReleaseCount = 0;
    in_RDI->ReleaseList = (_ReleaseRec *)0x0;
    in_RDI->LockDefnsCount = 0;
    in_RDI->LockDefnsList = (_ReleaseRec *)0x0;
    in_stack_fffffffffffffee0 =
         (SstStream)
         FillMetadataMsg((SstStream)CONCAT44(in_stack_fffffffffffffef4,local_9c),
                         in_stack_fffffffffffffee8,(MetadataPlusDPInfo *)in_stack_fffffffffffffee0);
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    piVar4 = (int *)CP_distributeDataFromRankZero
                              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_fffffffffffffef0 = local_9c;
    if (in_RDI->FreeMetadataUpcall != (FreeMetadataUpcallFunc)0x0) {
      (*in_RDI->FreeMetadataUpcall)
                (in_RDI->UpcallWriter,local_58->Metadata,local_58->AttributeData,
                 in_stack_fffffffffffffee0);
      in_stack_fffffffffffffef0 = local_9c;
    }
    free(__ptr);
    if (__ptr_00 != (_ReleaseRec *)0x0) {
      free(__ptr_00);
    }
    if (__ptr_01 != (_ReleaseRec *)0x0) {
      free(__ptr_01);
    }
    free(in_stack_ffffffffffffff18);
    free(in_stack_ffffffffffffff20);
  }
  else {
    piVar4 = (int *)CP_distributeDataFromRankZero
                              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    pFVar5 = AddUniqueFormats((FFSFormatList)in_stack_ffffffffffffff00,
                              (FFSFormatList)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    in_RDI->PreviousFormats = pFVar5;
  }
  free(local_38);
  local_8c = piVar4[1];
  memcpy(local_58,piVar4 + 2,0x38);
  local_58->CohortSize = in_RDI->CohortSize;
  local_58->Timestep = in_RCX;
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstInternalProvideTimestep::timerMD);
  }
  p_Var3->Msg = local_58;
  p_Var3->MetadataArray = local_58->Metadata;
  p_Var3->DP_TimestepInfo = local_58->DP_TimestepInfo;
  p_Var3->DataBlockToFree = in_stack_ffffffffffffffc0;
  ProcessReaderStatusList
            (in_stack_fffffffffffffed0,
             (ReturnMetadataInfo)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar7 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  ProcessLockDefnsList
            (in_stack_fffffffffffffee0,
             (ReturnMetadataInfo)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if ((in_RDI->ConfigParams->CPCommPattern == 0) && (in_RDI->Rank != 0)) {
    ProcessReleaseList(in_stack_fffffffffffffee0,
                       (ReturnMetadataInfo)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  ActOnTSLockStatus(in_stack_fffffffffffffee0,
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerTS == (void *)0x0) {
      SstInternalProvideTimestep::timerTS = (void *)ps_timer_create_("provide timestep operations");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerTS);
  }
  if (*piVar4 == 0) {
    CP_verbose(in_RDI,PerStepVerbose,
               "Sending TimestepMetadata for timestep %ld (ref count %d), one to each reader\n",
               in_RCX,(ulong)(uint)p_Var3->ReferenceCount);
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
    SendTimestepEntryToReaders(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    p_Var3->InProgressFlag = 0;
    SubRefTimestep(in_stack_fffffffffffffee0,
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),iVar7);
    QueueMaintenance((SstStream)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  }
  else {
    local_58->Metadata = (SstData)0x0;
    local_58->DP_TimestepInfo = (void **)0x0;
    CP_verbose(in_RDI,PerStepVerbose,
               "Sending Empty TimestepMetadata for Discarded timestep %ld, one to each reader\n",
               in_RCX);
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
    sendOneToEachReaderRank
              ((SstStream)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (CMFormat)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               (void **)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    p_Var3->Expired = 1;
    p_Var3->ReferenceCount = 0;
    QueueMaintenance((SstStream)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  }
  do {
    iVar7 = local_8c + -1;
    if (local_8c == 0) {
LAB_00f53ec0:
      if (_perfstubs_initialized == 1) {
        ps_timer_stop_(SstInternalProvideTimestep::timerTS);
      }
      return;
    }
    if (in_RDI->Rank == 0) {
      CP_verbose(in_RDI,SummaryVerbose,"Writer side ReaderLateArrival accepting incoming reader\n");
    }
    p_Var6 = WriterParticipateInReaderOpen(Stream_00);
    if (p_Var6 == (WS_ReaderInfo)0x0) {
      CP_error(in_RDI,"Potential reader registration failed\n");
      goto LAB_00f53ec0;
    }
    local_8c = iVar7;
    if (in_RDI->ConfigParams->CPCommPattern == 1) {
      waitForReaderResponseAndSendQueued
                ((WS_ReaderInfo)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    else if (in_RDI->Rank == 0) {
      waitForReaderResponseAndSendQueued
                ((WS_ReaderInfo)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
      in_stack_fffffffffffffecc = p_Var6->ReaderStatus;
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
      SMPI_Bcast(TimestepMetaData.Msg.DP_TimestepInfo,TimestepMetaData.Msg.AttributeData._4_4_,
                 (SMPI_Datatype)TimestepMetaData.Msg.AttributeData,
                 TimestepMetaData.Msg.Metadata._4_4_,(SMPI_Comm)TimestepMetaData.Msg.Formats);
    }
    else {
      SMPI_Bcast(TimestepMetaData.Msg.DP_TimestepInfo,TimestepMetaData.Msg.AttributeData._4_4_,
                 (SMPI_Datatype)TimestepMetaData.Msg.AttributeData,
                 TimestepMetaData.Msg.Metadata._4_4_,(SMPI_Comm)TimestepMetaData.Msg.Formats);
      pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
      p_Var6->ReaderStatus = in_stack_fffffffffffffecc;
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    }
  } while( true );
}

Assistant:

extern void SstInternalProvideTimestep(SstStream Stream, SstData LocalMetadata, SstData Data,
                                       ssize_t Timestep, FFSFormatList Formats,
                                       DataFreeFunc FreeTimestep, void *FreeClientData,
                                       SstData AttributeData, DataFreeFunc FreeAttributeData,
                                       void *FreeAttributelientData)
{
    void *data_block1, *data_block2;
    MetadataPlusDPInfo *pointers;
    ReturnMetadataInfo ReturnData;
    struct _TimestepMetadataMsg *Msg = malloc(sizeof(*Msg));
    void *DP_TimestepInfo = NULL;
    struct _MetadataPlusDPInfo Md;
    CPTimestepList Entry = calloc(1, sizeof(struct _CPTimestepEntry));
    int PendingReaderCount = 0;

    memset(Msg, 0, sizeof(*Msg));
    STREAM_MUTEX_LOCK(Stream);
    Stream->WriterTimestep = Timestep;

    STREAM_MUTEX_UNLOCK(Stream);
    Stream->DP_Interface->provideTimestep(&Svcs, Stream->DP_Stream, Data, LocalMetadata, Timestep,
                                          &DP_TimestepInfo);
    if (Formats)
    {
        FFSFormatList tmp = Formats;
        while (tmp)
        {
            tmp = tmp->Next;
        }
    }
    STREAM_MUTEX_LOCK(Stream);

    /* Md is the local contribution to MetaData */
    Md.Formats = Formats;
    Md.Metadata = (SstData)LocalMetadata;
    Md.AttributeData = (SstData)AttributeData;
    Md.DP_TimestepInfo = DP_TimestepInfo;

    if (Data)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local data size", Data->DataSize);
    }
    if (LocalMetadata)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local metadata size", LocalMetadata->DataSize);
    }

    /* preliminary queue of message before metadata collection.  Timestep may
     * still be discarded.*/

    Stream->LastProvidedTimestep = Timestep;
    if (Stream->ConfigParams->FirstTimestepPrecious && (Timestep == 0))
    {
        Entry->PreciousTimestep = 1;
    }
    Entry->ReferenceCount = 1; /* holding one for us, so it doesn't disappear under us */
    Entry->DPRegistered = 1;
    Entry->Timestep = Timestep;
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->FreeTimestep = FreeTimestep;
    Entry->FreeClientData = FreeClientData;
    Entry->Next = Stream->QueuedTimesteps;
    Entry->InProgressFlag = 1;

    Stream->QueuedTimesteps = Entry;
    Stream->QueuedTimestepCount++;
    Stream->Stats.TimestepsCreated++;
    /* no one waits on timesteps being added, so no condition signal to note
     * change */

    STREAM_MUTEX_UNLOCK(Stream);

    PERFSTUBS_TIMER_START(timerMD, "Metadata Consolidation time in EndStep()");
    pointers = (MetadataPlusDPInfo *)CP_consolidateDataToRankZero(
        Stream, &Md, Stream->CPInfo->PerRankMetadataFormat, &data_block1);

    if (Stream->Rank == 0)
    {
        int DiscardThisTimestep = 0;
        struct _ReturnMetadataInfo TimestepMetaData;
        RegisterQueue ArrivingReader;
        void *MetadataFreeValue;
        STREAM_MUTEX_LOCK(Stream);
        ArrivingReader = Stream->ReaderRegisterQueue;
        QueueMaintenance(Stream);
        if (Stream->QueueFullPolicy == SstQueueFullDiscard)
        {
            CP_verbose(Stream, TraceVerbose,
                       "Testing Discard Condition, Queued Timestep Count %d, "
                       "QueueLimit %d\n",
                       Stream->QueuedTimestepCount, Stream->QueueLimit);
            QueueMaintenance(Stream);
            if (Stream->QueuedTimestepCount > Stream->QueueLimit)
            {
                DiscardThisTimestep = 1;
            }
        }
        else
        {
            while ((Stream->QueueLimit > 0) && (Stream->QueuedTimestepCount > Stream->QueueLimit))
            {
                CP_verbose(Stream, PerStepVerbose, "Blocking on QueueFull condition\n");
                STREAM_CONDITION_WAIT(Stream);
            }
        }
        memset(&TimestepMetaData, 0, sizeof(TimestepMetaData));
        TimestepMetaData.PendingReaderCount = 0;
        while (ArrivingReader)
        {
            TimestepMetaData.PendingReaderCount++;
            ArrivingReader = ArrivingReader->Next;
        }

        TimestepMetaData.DiscardThisTimestep = DiscardThisTimestep;
        TimestepMetaData.ReleaseCount = Stream->ReleaseCount;
        TimestepMetaData.ReleaseList = Stream->ReleaseList;
        TimestepMetaData.LockDefnsCount = Stream->LockDefnsCount;
        TimestepMetaData.LockDefnsList = Stream->LockDefnsList;
        TimestepMetaData.ReaderStatus = malloc(sizeof(enum StreamStatus) * Stream->ReaderCount);
        TimestepMetaData.ReaderCount = Stream->ReaderCount;
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            TimestepMetaData.ReaderStatus[i] = Stream->Readers[i]->ReaderStatus;
        }
        Stream->ReleaseCount = 0;
        Stream->ReleaseList = NULL;
        Stream->LockDefnsCount = 0;
        Stream->LockDefnsList = NULL;
        MetadataFreeValue = FillMetadataMsg(Stream, &TimestepMetaData.Msg, pointers);
        STREAM_MUTEX_UNLOCK(Stream);
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &TimestepMetaData, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        if (Stream->FreeMetadataUpcall)
        {
            Stream->FreeMetadataUpcall(Stream->UpcallWriter, Msg->Metadata, Msg->AttributeData,
                                       MetadataFreeValue);
        }
        free(TimestepMetaData.ReaderStatus);
        if (TimestepMetaData.ReleaseList)
            free(TimestepMetaData.ReleaseList);
        if (TimestepMetaData.LockDefnsList)
            free(TimestepMetaData.LockDefnsList);
        free(TimestepMetaData.Msg.Metadata);
        free(TimestepMetaData.Msg.AttributeData);
    }
    else
    {
        /* other ranks */
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        Stream->PreviousFormats =
            AddUniqueFormats(Stream->PreviousFormats, ReturnData->Msg.Formats, /*copy*/ 1);
    }
    free(data_block1);
    PendingReaderCount = ReturnData->PendingReaderCount;
    *Msg = ReturnData->Msg;
    Msg->CohortSize = Stream->CohortSize;
    Msg->Timestep = Timestep;
    PERFSTUBS_TIMER_STOP(timerMD);

    /*
     * lock this Stream's data and queue the timestep
     */
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->DataBlockToFree = data_block2;

    ProcessReaderStatusList(Stream, ReturnData);

    ProcessLockDefnsList(Stream, ReturnData);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank != 0))
    {
        ProcessReleaseList(Stream, ReturnData);
    }
    ActOnTSLockStatus(Stream, Timestep);
    PERFSTUBS_TIMER_START(timerTS, "provide timestep operations");
    if (ReturnData->DiscardThisTimestep)
    {
        /* Data was actually discarded, but we want to send a message to each
         * reader so that it knows a step was discarded, but actually so that we
         * get an error return if the write fails */

        Msg->Metadata = NULL;
        Msg->DP_TimestepInfo = NULL;

        CP_verbose(Stream, PerStepVerbose,
                   "Sending Empty TimestepMetadata for Discarded "
                   "timestep %ld, one to each reader\n",
                   Timestep);

        STREAM_MUTEX_LOCK(Stream);
        sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,
                                Msg, &Msg->RS_Stream);

        Entry->Expired = 1;
        Entry->ReferenceCount = 0;
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    else
    {

        CP_verbose(Stream, PerStepVerbose,
                   "Sending TimestepMetadata for timestep %ld (ref count "
                   "%d), one to each reader\n",
                   Timestep, Entry->ReferenceCount);

        STREAM_MUTEX_LOCK(Stream);
        SendTimestepEntryToReaders(Stream, Entry);
        Entry->InProgressFlag = 0;
        SubRefTimestep(Stream, Entry->Timestep, 0);
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    while (PendingReaderCount--)
    {
        WS_ReaderInfo reader;
        if (Stream->Rank == 0)
        {
            CP_verbose(Stream, SummaryVerbose,
                       "Writer side ReaderLateArrival accepting incoming reader\n");
        }
        reader = WriterParticipateInReaderOpen(Stream);
        if (!reader)
        {
            CP_error(Stream, "Potential reader registration failed\n");
            break;
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
        {
            waitForReaderResponseAndSendQueued(reader);
        }
        else
        {
            enum StreamStatus LocalStatus;
            if (Stream->Rank == 0)
            {
                waitForReaderResponseAndSendQueued(reader);
                STREAM_MUTEX_LOCK(Stream);
                LocalStatus = reader->ReaderStatus;
                STREAM_MUTEX_UNLOCK(Stream);
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
            else
            {
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
                STREAM_MUTEX_LOCK(Stream);
                reader->ReaderStatus = LocalStatus;
                STREAM_MUTEX_UNLOCK(Stream);
            }
        }
    }
    PERFSTUBS_TIMER_STOP(timerTS);
}